

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O2

void __thiscall
sglr::GLContext::deleteRenderbuffers(GLContext *this,int numRenderbuffers,deUint32 *renderbuffers)

{
  long lVar1;
  ulong uVar2;
  
  lVar1 = 0;
  uVar2 = 0;
  if (0 < numRenderbuffers) {
    uVar2 = (ulong)(uint)numRenderbuffers;
  }
  for (; uVar2 * 4 != lVar1; lVar1 = lVar1 + 4) {
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::erase(&(this->m_allocatedRbos)._M_t,(key_type_conflict *)((long)renderbuffers + lVar1));
  }
  glu::CallLogWrapper::glDeleteRenderbuffers(this->m_wrapper,numRenderbuffers,renderbuffers);
  return;
}

Assistant:

void GLContext::deleteRenderbuffers (int numRenderbuffers, const deUint32* renderbuffers)
{
	for (int i = 0; i < numRenderbuffers; i++)
		m_allocatedRbos.erase(renderbuffers[i]);
	m_wrapper->glDeleteRenderbuffers(numRenderbuffers, renderbuffers);
}